

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imcompress.c
# Opt level: O3

int fits_unset_compression_param(fitsfile *fptr,int *status)

{
  FITSfile *pFVar1;
  
  pFVar1 = fptr->Fptr;
  pFVar1->hcomp_scale = 0.0;
  *(undefined8 *)&pFVar1->compress_type = 0;
  *(undefined8 *)((long)pFVar1->tilesize + 4) = 0;
  *(undefined8 *)((long)pFVar1->tilesize + 0xc) = 0;
  *(undefined8 *)((long)pFVar1->tilesize + 0x14) = 0;
  *(undefined8 *)((long)pFVar1->tilesize + 0x1c) = 0;
  *(undefined8 *)((long)pFVar1->tilesize + 0x24) = 0;
  *(undefined8 *)((long)pFVar1->tilesize + 0x2c) = 0;
  pFVar1->quantize_method = 0;
  pFVar1->dither_seed = 0;
  return *status;
}

Assistant:

int fits_unset_compression_param(
      fitsfile *fptr,
      int *status) 
{
    int ii;

    (fptr->Fptr)->compress_type = 0;
    (fptr->Fptr)->quantize_level = 0;
    (fptr->Fptr)->quantize_method = 0;
    (fptr->Fptr)->dither_seed = 0; 
    (fptr->Fptr)->hcomp_scale = 0;

    for (ii = 0; ii < MAX_COMPRESS_DIM; ii++)
    {
        (fptr->Fptr)->tilesize[ii] = 0;
    }

    return(*status);
}